

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O3

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_GE_Test::Body(iu_SyntaxTest_x_iutest_x_GE_Test *this)

{
  return;
}

Assistant:

IUTEST(SyntaxTest, GE)
{
    if( int x = 1 )
        IUTEST_ASSERT_GE(1, x) << x;
    if( int x = 1 )
        IUTEST_EXPECT_GE(1, x) << x;
    if( int x = 1 )
        IUTEST_INFORM_GE(1, x) << x;
    if( int x = 1 )
        IUTEST_ASSUME_GE(1, x) << x;
}